

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,int depth)

{
  int iVar1;
  xmlSchemaIDCMatcherPtr_conflict pxVar2;
  xmlSchemaNodeInfoPtr pxVar3;
  xmlSchemaIDCStateObjPtr pxVar4;
  xmlSchemaItemListPtr list;
  xmlSchemaIDCPtr_conflict pxVar5;
  bool bVar6;
  int iVar7;
  xmlSchemaPSVIIDCKeyPtr **pppxVar8;
  xmlChar *pxVar9;
  xmlSchemaPSVIIDCKeyPtr *__s;
  xmlSchemaPSVIIDCKeyPtr key;
  xmlSchemaPSVIIDCKeyPtr *ppxVar10;
  undefined8 *puVar11;
  xmlSchemaPSVIIDCNodePtr pxVar12;
  xmlSchemaPSVIIDCNodePtr *ppxVar13;
  xmlSchemaAttributePtr_conflict pxVar14;
  undefined8 *puVar15;
  xmlSchemaTypePtr pxVar16;
  xmlNodePtr extraout_RDX;
  long *plVar17;
  xmlNodePtr extraout_RDX_00;
  xmlNodePtr extraout_RDX_01;
  xmlNodePtr node;
  xmlNodePtr extraout_RDX_02;
  xmlNodePtr extraout_RDX_03;
  xmlNodePtr node_00;
  xmlNodePtr extraout_RDX_04;
  xmlNodePtr extraout_RDX_05;
  xmlNodePtr pxVar18;
  char *pcVar19;
  ulong uVar20;
  xmlSchemaIDCPtr_conflict pxVar21;
  int iVar22;
  long lVar23;
  xmlChar *pxVar24;
  xmlSchemaIDCStateObjPtr_conflict pxVar25;
  long lVar26;
  xmlSchemaTypePtr pxVar27;
  xmlSchemaIDCPtr_conflict local_98;
  xmlSchemaTypePtr local_90;
  xmlSchemaTypePtr local_88;
  xmlSchemaPSVIIDCNodePtr local_80;
  xmlSchemaIDCPtr_conflict local_78;
  xmlChar *local_70;
  uint local_64;
  xmlSchemaTypePtr local_60;
  xmlSchemaPSVIIDCKeyPtr local_58;
  char *local_50;
  xmlChar *local_48;
  undefined8 *local_40;
  long local_38;
  
  if (vctxt->xpathStates == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    return 0;
  }
  pxVar27 = vctxt->inode->typeDef;
  local_58 = (xmlSchemaPSVIIDCKeyPtr)0x0;
  local_38 = (long)depth;
  local_50 = "re-allocating the IDC node table item list";
  pxVar25 = vctxt->xpathStates;
LAB_001c4a77:
  if (pxVar25 == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    return 0;
  }
  iVar7 = xmlStreamPop((xmlStreamCtxtPtr)pxVar25->xpathCtxt);
  if (iVar7 == -1) {
    pcVar19 = "calling xmlStreamPop()";
LAB_001c546d:
    xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathProcessHistory",pcVar19);
    return -1;
  }
  if ((long)pxVar25->nbHistory == 0) goto LAB_001c5032;
  if (pxVar25->history[(long)pxVar25->nbHistory + -1] == depth) {
    if (pxVar25->type == 1) {
      pxVar16 = (xmlSchemaTypePtr)pxVar25->matcher;
      pxVar21 = *(xmlSchemaIDCPtr_conflict *)(pxVar16->id + 8);
      if ((pxVar16->refNs == (xmlChar *)0x0) ||
         (lVar23 = local_38 - *(int *)&pxVar16->field_0x4, local_88 = pxVar16,
         *(int *)&pxVar16->annot <= (int)lVar23)) {
        if (pxVar21->type != XML_SCHEMA_TYPE_IDC_KEY) goto LAB_001c5020;
        plVar17 = (long *)0x0;
LAB_001c4c1b:
        local_98 = (xmlSchemaIDCPtr_conflict)0x0;
        local_90 = pxVar27;
        pxVar24 = xmlSchemaGetComponentDesignation((xmlChar **)&local_98,pxVar21);
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                           (xmlSchemaBasicItemPtr)pxVar21,"Not all fields of %s evaluate to a node",
                           pxVar24,(xmlChar *)0x0);
        pxVar27 = local_90;
        if (local_98 != (xmlSchemaIDCPtr_conflict)0x0) {
          (*xmlFree)(local_98);
          pxVar27 = local_90;
        }
      }
      else {
        plVar17 = (long *)(pxVar16->refNs + lVar23 * 8);
        if (*plVar17 == 0) {
          if (pxVar21->type != XML_SCHEMA_TYPE_IDC_KEY) goto LAB_001c5020;
          goto LAB_001c4c1b;
        }
        local_64 = pxVar21->nbFields;
        pxVar24 = (xmlChar *)0x0;
        if (0 < (int)local_64) {
          pxVar24 = (xmlChar *)(ulong)local_64;
        }
        pxVar9 = (xmlChar *)0x0;
        do {
          if (pxVar24 == pxVar9) {
            local_60 = pxVar16->subtypes;
            local_78 = pxVar21;
            if (local_60 == (xmlSchemaTypePtr)0x0) {
              local_60 = (xmlSchemaTypePtr)xmlSchemaItemListCreate();
              local_88->subtypes = local_60;
            }
            pxVar16 = local_88;
            if ((local_78->type == XML_SCHEMA_TYPE_IDC_KEYREF) || (*(int *)&local_60->next == 0))
            goto LAB_001c5120;
            local_70 = pxVar24;
            if (local_88->attributes == (xmlSchemaAttributePtr_conflict)0x0) {
              puVar11 = (undefined8 *)0x0;
              pxVar21 = local_78;
            }
            else {
              local_98 = (xmlSchemaIDCPtr_conflict)0x0;
              xmlSchemaHashKeySequence
                        (vctxt,(xmlChar **)&local_98,(xmlSchemaPSVIIDCKeyPtr *)*plVar17,local_64);
              pxVar5 = local_98;
              puVar11 = (undefined8 *)
                        xmlHashLookup((xmlHashTablePtr)pxVar16->attributes,(xmlChar *)local_98);
              pxVar24 = local_70;
              pxVar21 = local_78;
              if (pxVar5 != (xmlSchemaIDCPtr_conflict)0x0) {
                (*xmlFree)(pxVar5);
                pxVar24 = local_70;
                pxVar21 = local_78;
              }
            }
            goto LAB_001c5088;
          }
          lVar23 = (long)pxVar9 * 8;
          pxVar9 = pxVar9 + 1;
        } while (*(long *)(*plVar17 + lVar23) != 0);
        if (pxVar21->type == XML_SCHEMA_TYPE_IDC_KEY) goto LAB_001c4c1b;
      }
      if (plVar17 == (long *)0x0) goto LAB_001c5020;
      goto LAB_001c4c7d;
    }
    if (pxVar25->type != 2) goto LAB_001c5020;
    if ((pxVar27->type == XML_SCHEMA_TYPE_COMPLEX) ||
       (pxVar16 = pxVar27, pxVar27->builtInType == 0x2d)) {
      if ((pxVar27->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
        pxVar16 = pxVar27->contentTypeDef;
        if (pxVar16 == (xmlSchemaTypePtr)0x0) {
          pcVar19 = 
          "field resolves to a CT with simple content but the CT is missing the ST definition";
          goto LAB_001c546d;
        }
        goto LAB_001c4af7;
      }
      local_98 = (xmlSchemaIDCPtr_conflict)0x0;
      pxVar21 = pxVar25->matcher->aidc->def;
      pxVar24 = pxVar25->sel->xpath;
      local_90 = pxVar27;
      pxVar9 = xmlSchemaGetComponentDesignation((xmlChar **)&local_98,pxVar21);
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                         (xmlSchemaBasicItemPtr)pxVar21,
                         "The XPath \'%s\' of a field of %s does evaluate to a node of non-simple type"
                         ,pxVar24,pxVar9);
joined_r0x001c4dc2:
      if (local_98 != (xmlSchemaIDCPtr_conflict)0x0) {
        (*xmlFree)(local_98);
      }
      iVar7 = pxVar25->nbHistory + -1;
      pxVar25->nbHistory = iVar7;
      pxVar27 = local_90;
    }
    else {
LAB_001c4af7:
      if ((local_58 != (xmlSchemaPSVIIDCKeyPtr)0x0) || (vctxt->inode->val != (xmlSchemaValPtr)0x0))
      {
        pxVar2 = pxVar25->matcher;
        lVar23 = (long)pxVar25->depth - (long)pxVar2->depth;
        iVar7 = pxVar25->sel->index;
        iVar22 = (int)lVar23;
        local_88 = pxVar16;
        if (pxVar2->keySeqs == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
          uVar20 = (ulong)(uint)(iVar22 * 2);
          if (iVar22 < 10) {
            uVar20 = 10;
          }
          pxVar2->sizeKeySeqs = (int)uVar20;
          local_90 = pxVar27;
          pppxVar8 = (xmlSchemaPSVIIDCKeyPtr **)(*xmlMalloc)(uVar20 << 3);
          pxVar2->keySeqs = pppxVar8;
          if (pppxVar8 == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
            pcVar19 = "allocating an array of key-sequences";
            pxVar18 = extraout_RDX_00;
            goto LAB_001c54b4;
          }
          memset(pppxVar8,0,(long)pxVar2->sizeKeySeqs << 3);
        }
        else {
          iVar1 = pxVar2->sizeKeySeqs;
          lVar26 = (long)iVar1;
          local_90 = pxVar27;
          if (iVar1 <= iVar22) {
            pxVar2->sizeKeySeqs = iVar1 * 2;
            pppxVar8 = (xmlSchemaPSVIIDCKeyPtr **)(*xmlRealloc)(pxVar2->keySeqs,lVar26 << 4);
            pxVar2->keySeqs = pppxVar8;
            if (pppxVar8 == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
              pcVar19 = "reallocating an array of key-sequences";
              pxVar18 = extraout_RDX;
              goto LAB_001c54b4;
            }
            iVar22 = pxVar2->sizeKeySeqs;
            for (; lVar26 < iVar22; lVar26 = lVar26 + 1) {
              pxVar2->keySeqs[lVar26] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
            }
          }
        }
        __s = pxVar2->keySeqs[lVar23];
        if (__s == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
          __s = (xmlSchemaPSVIIDCKeyPtr *)(*xmlMalloc)((long)pxVar2->aidc->def->nbFields << 3);
          if (__s == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
            pcVar19 = "allocating an IDC key-sequence";
            pxVar18 = extraout_RDX_01;
LAB_001c54b4:
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,pcVar19,pxVar18);
            return -1;
          }
          memset(__s,0,(long)pxVar2->aidc->def->nbFields << 3);
          pxVar2->keySeqs[lVar23] = __s;
        }
        else if (__s[iVar7] != (xmlSchemaPSVIIDCKeyPtr)0x0) {
          local_98 = (xmlSchemaIDCPtr_conflict)0x0;
          pxVar21 = pxVar2->aidc->def;
          pxVar24 = pxVar25->sel->xpath;
          pxVar9 = xmlSchemaGetComponentDesignation((xmlChar **)&local_98,pxVar21);
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                             (xmlSchemaBasicItemPtr)pxVar21,
                             "The XPath \'%s\' of a field of %s evaluates to a node-set with more than one member"
                             ,pxVar24,pxVar9);
          goto joined_r0x001c4dc2;
        }
        key = local_58;
        if (local_58 == (xmlSchemaPSVIIDCKeyPtr)0x0) {
          key = (xmlSchemaPSVIIDCKeyPtr)(*xmlMalloc)(0x10);
          if (key == (xmlSchemaPSVIIDCKeyPtr)0x0) {
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating a IDC key",node);
            (*xmlFree)(__s);
            pxVar2->keySeqs[lVar23] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
            return -1;
          }
          key->type = local_88;
          pxVar3 = vctxt->inode;
          key->val = pxVar3->val;
          pxVar3->val = (xmlSchemaValPtr)0x0;
          ppxVar10 = vctxt->idcKeys;
          if (ppxVar10 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
            ppxVar10 = (xmlSchemaPSVIIDCKeyPtr *)(*xmlMalloc)(0x140);
            vctxt->idcKeys = ppxVar10;
            if (ppxVar10 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
              pcVar19 = "allocating the IDC key storage list";
              pxVar18 = extraout_RDX_03;
LAB_001c5556:
              xmlSchemaVErrMemory(vctxt,pcVar19,pxVar18);
              xmlSchemaIDCFreeKey(key);
              return -1;
            }
            vctxt->sizeIdcKeys = 0x28;
          }
          else {
            iVar22 = vctxt->sizeIdcKeys;
            if (iVar22 <= vctxt->nbIdcKeys) {
              vctxt->sizeIdcKeys = iVar22 * 2;
              ppxVar10 = (xmlSchemaPSVIIDCKeyPtr *)(*xmlRealloc)(ppxVar10,(long)iVar22 << 4);
              vctxt->idcKeys = ppxVar10;
              if (ppxVar10 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                pcVar19 = "re-allocating the IDC key storage list";
                pxVar18 = extraout_RDX_02;
                goto LAB_001c5556;
              }
            }
          }
          iVar22 = vctxt->nbIdcKeys;
          vctxt->nbIdcKeys = iVar22 + 1;
          ppxVar10[iVar22] = key;
        }
        __s[iVar7] = key;
        pxVar27 = local_90;
        local_58 = key;
        goto LAB_001c5020;
      }
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                         (xmlSchemaBasicItemPtr)pxVar25->matcher->aidc->def,
                         "Warning: No precomputed value available, the value was either invalid or something strange happened"
                         ,(xmlChar *)0x0,(xmlChar *)0x0);
      iVar7 = pxVar25->nbHistory + -1;
      pxVar25->nbHistory = iVar7;
      local_58 = (xmlSchemaPSVIIDCKeyPtr)0x0;
    }
    goto LAB_001c502a;
  }
  goto LAB_001c4aa9;
LAB_001c5088:
  local_90 = pxVar27;
  pxVar27 = local_90;
  if (puVar11 == (undefined8 *)0x0) goto LAB_001c5120;
  local_80 = *(xmlSchemaPSVIIDCNodePtr *)
              (*(long *)(*(long *)local_60 + (long)*(int *)(puVar11 + 1) * 8) + 8);
  bVar6 = false;
  local_40 = puVar11;
  for (pxVar9 = (xmlChar *)0x0; pxVar24 != pxVar9; pxVar9 = pxVar9 + 1) {
    iVar7 = xmlSchemaAreValuesEqual
                      (*(xmlSchemaValPtr *)(*(long *)(*plVar17 + (long)pxVar9 * 8) + 8),
                       *(xmlSchemaValPtr *)&(&local_80->node)[(long)pxVar9]->type);
    if (iVar7 == -1) {
      return -1;
    }
    pxVar24 = local_70;
    pxVar21 = local_78;
    if (iVar7 == 0) goto LAB_001c510e;
    bVar6 = true;
  }
  if (bVar6) {
    local_98 = (xmlSchemaIDCPtr_conflict)0x0;
    local_48 = (xmlChar *)0x0;
    pxVar24 = xmlSchemaFormatIDCKeySequence
                        (vctxt,(xmlChar **)&local_98,(xmlSchemaPSVIIDCKeyPtr *)*plVar17,local_64);
    pxVar9 = xmlSchemaGetComponentDesignation(&local_48,pxVar21);
    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                       (xmlSchemaBasicItemPtr)pxVar21,"Duplicate key-sequence %s in %s",pxVar24,
                       pxVar9);
    if (local_98 != (xmlSchemaIDCPtr_conflict)0x0) {
      (*xmlFree)(local_98);
    }
    pxVar27 = local_90;
    if (local_48 != (xmlChar *)0x0) {
      (*xmlFree)(local_48);
      pxVar27 = local_90;
    }
    goto LAB_001c4c7d;
  }
LAB_001c510e:
  puVar11 = (undefined8 *)*local_40;
  pxVar27 = local_90;
  goto LAB_001c5088;
LAB_001c5120:
  pxVar12 = (xmlSchemaPSVIIDCNodePtr)(*xmlMalloc)(0x18);
  if (pxVar12 == (xmlSchemaPSVIIDCNodePtr)0x0) {
    xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating an IDC node-table item",node_00);
    (*xmlFree)((void *)*plVar17);
    goto LAB_001c5599;
  }
  pxVar12->nodeLine = 0;
  pxVar12->nodeQNameID = 0;
  pxVar12->node = (xmlNodePtr)0x0;
  pxVar12->keys = (xmlSchemaPSVIIDCKeyPtr *)0x0;
  local_80 = pxVar12;
  if (local_78->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
    local_70 = vctxt->inode->nsName;
    pxVar24 = xmlDictLookup(vctxt->dict,vctxt->inode->localName,-1);
    if (pxVar24 == (xmlChar *)0x0) {
LAB_001c552c:
      local_80->nodeQNameID = -1;
    }
    else {
      if (local_70 == (xmlChar *)0x0) {
        pxVar9 = (xmlChar *)0x0;
      }
      else {
        pxVar9 = xmlDictLookup(vctxt->dict,local_70,-1);
        if (pxVar9 == (xmlChar *)0x0) goto LAB_001c552c;
      }
      list = vctxt->nodeQNames;
      iVar7 = list->nbItems;
      for (lVar23 = 0; local_90 = pxVar27, lVar23 < iVar7; lVar23 = lVar23 + 2) {
        if (((xmlChar *)list->items[lVar23] == pxVar24) &&
           ((xmlChar *)list->items[lVar23 + 1] == pxVar9)) goto LAB_001c52cb;
      }
      local_70 = pxVar9;
      xmlSchemaItemListAdd(list,pxVar24);
      xmlSchemaItemListAdd(vctxt->nodeQNames,local_70);
      local_80->nodeQNameID = iVar7;
      pxVar27 = local_90;
      if (iVar7 != -1) goto LAB_001c52d4;
    }
    (*xmlFree)(local_80);
LAB_001c5592:
    (*xmlFree)((void *)*plVar17);
LAB_001c5599:
    *plVar17 = 0;
    return -1;
  }
  ppxVar13 = vctxt->idcNodes;
  if (ppxVar13 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
    ppxVar13 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)(0xa0);
    vctxt->idcNodes = ppxVar13;
    if (ppxVar13 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
      local_50 = "allocating the IDC node table item list";
      pxVar18 = extraout_RDX_05;
LAB_001c5577:
      xmlSchemaVErrMemory(vctxt,local_50,pxVar18);
      (*xmlFree)(local_80);
      goto LAB_001c5592;
    }
    vctxt->sizeIdcNodes = 0x14;
  }
  else {
    iVar7 = vctxt->sizeIdcNodes;
    if (iVar7 <= vctxt->nbIdcNodes) {
      vctxt->sizeIdcNodes = iVar7 * 2;
      ppxVar13 = (xmlSchemaPSVIIDCNodePtr *)(*xmlRealloc)(ppxVar13,(long)iVar7 << 4);
      vctxt->idcNodes = ppxVar13;
      pxVar18 = extraout_RDX_04;
      if (ppxVar13 == (xmlSchemaPSVIIDCNodePtr *)0x0) goto LAB_001c5577;
    }
  }
  iVar7 = vctxt->nbIdcNodes;
  vctxt->nbIdcNodes = iVar7 + 1;
  ppxVar13[iVar7] = local_80;
  lVar23 = 0xffffffff;
LAB_001c52cb:
  local_80->nodeQNameID = (int)lVar23;
LAB_001c52d4:
  local_80->node = vctxt->node;
  local_80->nodeLine = vctxt->inode->nodeLine;
  local_80->keys = (xmlSchemaPSVIIDCKeyPtr *)*plVar17;
  *plVar17 = 0;
  iVar7 = xmlSchemaItemListAdd((xmlSchemaItemListPtr)local_60,local_80);
  pxVar12 = local_80;
  if (iVar7 == -1) {
    if (local_78->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
      (*xmlFree)(local_80->keys);
      (*xmlFree)(pxVar12);
      return -1;
    }
    return -1;
  }
  if (local_78->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
    local_98 = (xmlSchemaIDCPtr_conflict)0x0;
    if (local_88->attributes == (xmlSchemaAttributePtr_conflict)0x0) {
      pxVar14 = (xmlSchemaAttributePtr_conflict)xmlHashCreate(4);
      local_88->attributes = pxVar14;
    }
    xmlSchemaHashKeySequence(vctxt,(xmlChar **)&local_98,local_80->keys,local_64);
    puVar11 = (undefined8 *)(*xmlMalloc)(0x10);
    *(int *)(puVar11 + 1) = *(int *)&local_60->next + -1;
    local_78 = local_98;
    puVar15 = (undefined8 *)xmlHashLookup((xmlHashTablePtr)local_88->attributes,(xmlChar *)local_98)
    ;
    if (puVar15 == (undefined8 *)0x0) {
      *puVar11 = 0;
      xmlHashAddEntry((xmlHashTablePtr)local_88->attributes,(xmlChar *)local_78,puVar11);
    }
    else {
      *puVar11 = *puVar15;
      *puVar15 = puVar11;
    }
    if (local_78 != (xmlSchemaIDCPtr_conflict)0x0) {
      (*xmlFree)(local_78);
    }
  }
LAB_001c4c7d:
  if ((void *)*plVar17 != (void *)0x0) {
    (*xmlFree)((void *)*plVar17);
    *plVar17 = 0;
  }
LAB_001c5020:
  iVar7 = pxVar25->nbHistory + -1;
  pxVar25->nbHistory = iVar7;
LAB_001c502a:
  if (iVar7 == 0) {
LAB_001c5032:
    if (pxVar25->depth == depth) {
      if (vctxt->xpathStates != pxVar25) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathProcessHistory",
                   "The state object to be removed is not the first in the list");
      }
      pxVar4 = pxVar25->next;
      vctxt->xpathStates = pxVar4;
      pxVar25->next = vctxt->xpathStatePool;
      vctxt->xpathStatePool = pxVar25;
      pxVar25 = pxVar4;
      goto LAB_001c4a77;
    }
  }
LAB_001c4aa9:
  pxVar25 = pxVar25->next;
  goto LAB_001c4a77;
}

Assistant:

static int
xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,
			     int depth)
{
    xmlSchemaIDCStateObjPtr sto, nextsto;
    int res, matchDepth;
    xmlSchemaPSVIIDCKeyPtr key = NULL;
    xmlSchemaTypePtr type = vctxt->inode->typeDef, simpleType = NULL;

    if (vctxt->xpathStates == NULL)
	return (0);
    sto = vctxt->xpathStates;

#ifdef DEBUG_IDC
    {
	xmlChar *str = NULL;
	xmlGenericError(xmlGenericErrorContext,
	    "IDC: BACK on %s, depth %d\n",
	    xmlSchemaFormatQName(&str, vctxt->inode->nsName,
		vctxt->inode->localName), vctxt->depth);
	FREE_AND_NULL(str)
    }
#endif
    /*
    * Evaluate the state objects.
    */
    while (sto != NULL) {
	res = xmlStreamPop((xmlStreamCtxtPtr) sto->xpathCtxt);
	if (res == -1) {
	    VERROR_INT("xmlSchemaXPathProcessHistory",
		"calling xmlStreamPop()");
	    return (-1);
	}
#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:   stream pop '%s'\n",
	    sto->sel->xpath);
#endif
	if (sto->nbHistory == 0)
	    goto deregister_check;

	matchDepth = sto->history[sto->nbHistory -1];

	/*
	* Only matches at the current depth are of interest.
	*/
	if (matchDepth != depth) {
	    sto = sto->next;
	    continue;
	}
	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_FIELD) {
	    /*
	    * NOTE: According to
	    *   http://www.w3.org/Bugs/Public/show_bug.cgi?id=2198
	    *   ... the simple-content of complex types is also allowed.
	    */

	    if (WXS_IS_COMPLEX(type)) {
		if (WXS_HAS_SIMPLE_CONTENT(type)) {
		    /*
		    * Sanity check for complex types with simple content.
		    */
		    simpleType = type->contentTypeDef;
		    if (simpleType == NULL) {
			VERROR_INT("xmlSchemaXPathProcessHistory",
			    "field resolves to a CT with simple content "
			    "but the CT is missing the ST definition");
			return (-1);
		    }
		} else
		    simpleType = NULL;
	    } else
		simpleType = type;
	    if (simpleType == NULL) {
		xmlChar *str = NULL;

		/*
		* Not qualified if the field resolves to a node of non
		* simple type.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "The XPath '%s' of a field of %s does evaluate to a node of "
		    "non-simple type",
		    sto->sel->xpath,
		    xmlSchemaGetIDCDesignation(&str, sto->matcher->aidc->def));
		FREE_AND_NULL(str);
		sto->nbHistory--;
		goto deregister_check;
	    }

	    if ((key == NULL) && (vctxt->inode->val == NULL)) {
		/*
		* Failed to provide the normalized value; maybe
		* the value was invalid.
		*/
		VERROR(XML_SCHEMAV_CVC_IDC,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "Warning: No precomputed value available, the value "
		    "was either invalid or something strange happened");
		sto->nbHistory--;
		goto deregister_check;
	    } else {
		xmlSchemaIDCMatcherPtr matcher = sto->matcher;
		xmlSchemaPSVIIDCKeyPtr *keySeq;
		int pos, idx;

		/*
		* The key will be anchored on the matcher's list of
		* key-sequences. The position in this list is determined
		* by the target node's depth relative to the matcher's
		* depth of creation (i.e. the depth of the scope element).
		*
		* Element        Depth    Pos   List-entries
		* <scope>          0              NULL
		*   <bar>          1              NULL
		*     <target/>    2       2      target
		*   <bar>
                * </scope>
		*
		* The size of the list is only dependent on the depth of
		* the tree.
		* An entry will be NULLed in selector_leave, i.e. when
		* we hit the target's
		*/
		pos = sto->depth - matcher->depth;
		idx = sto->sel->index;

		/*
		* Create/grow the array of key-sequences.
		*/
		if (matcher->keySeqs == NULL) {
		    if (pos > 9)
			matcher->sizeKeySeqs = pos * 2;
		    else
			matcher->sizeKeySeqs = 10;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlMalloc(matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating an array of key-sequences",
			    NULL);
			return(-1);
		    }
		    memset(matcher->keySeqs, 0,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		} else if (pos >= matcher->sizeKeySeqs) {
		    int i = matcher->sizeKeySeqs;

		    matcher->sizeKeySeqs *= 2;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlRealloc(matcher->keySeqs,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "reallocating an array of key-sequences",
			    NULL);
			return (-1);
		    }
		    /*
		    * The array needs to be NULLed.
		    * TODO: Use memset?
		    */
		    for (; i < matcher->sizeKeySeqs; i++)
			matcher->keySeqs[i] = NULL;
		}

		/*
		* Get/create the key-sequence.
		*/
		keySeq = matcher->keySeqs[pos];
		if (keySeq == NULL) {
		    goto create_sequence;
		} else if (keySeq[idx] != NULL) {
		    xmlChar *str = NULL;
		    /*
		    * cvc-identity-constraint:
		    * 3 For each node in the `target node set` all
		    * of the {fields}, with that node as the context
		    * node, evaluate to either an empty node-set or
		    * a node-set with exactly one member, which must
		    * have a simple type.
		    *
		    * The key was already set; report an error.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST matcher->aidc->def,
			"The XPath '%s' of a field of %s evaluates to a "
			"node-set with more than one member",
			sto->sel->xpath,
			xmlSchemaGetIDCDesignation(&str, matcher->aidc->def));
		    FREE_AND_NULL(str);
		    sto->nbHistory--;
		    goto deregister_check;
		} else
		    goto create_key;

create_sequence:
		/*
		* Create a key-sequence.
		*/
		keySeq = (xmlSchemaPSVIIDCKeyPtr *) xmlMalloc(
		    matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		if (keySeq == NULL) {
		    xmlSchemaVErrMemory(NULL,
			"allocating an IDC key-sequence", NULL);
		    return(-1);
		}
		memset(keySeq, 0, matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		matcher->keySeqs[pos] = keySeq;
create_key:
		/*
		* Create a key once per node only.
		*/
		if (key == NULL) {
		    key = (xmlSchemaPSVIIDCKeyPtr) xmlMalloc(
			sizeof(xmlSchemaPSVIIDCKey));
		    if (key == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating a IDC key", NULL);
			xmlFree(keySeq);
			matcher->keySeqs[pos] = NULL;
			return(-1);
		    }
		    /*
		    * Consume the compiled value.
		    */
		    key->type = simpleType;
		    key->val = vctxt->inode->val;
		    vctxt->inode->val = NULL;
		    /*
		    * Store the key in a global list.
		    */
		    if (xmlSchemaIDCStoreKey(vctxt, key) == -1) {
			xmlSchemaIDCFreeKey(key);
			return (-1);
		    }
		}
		keySeq[idx] = key;
	    }
	} else if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR) {

	    xmlSchemaPSVIIDCKeyPtr **keySeq = NULL;
	    /* xmlSchemaPSVIIDCBindingPtr bind; */
	    xmlSchemaPSVIIDCNodePtr ntItem;
	    xmlSchemaIDCMatcherPtr matcher;
	    xmlSchemaIDCPtr idc;
	    xmlSchemaItemListPtr targets;
	    int pos, i, j, nbKeys;
	    /*
	    * Here we have the following scenario:
	    * An IDC 'selector' state object resolved to a target node,
	    * during the time this target node was in the
	    * ancestor-or-self axis, the 'field' state object(s) looked
	    * out for matching nodes to create a key-sequence for this
	    * target node. Now we are back to this target node and need
	    * to put the key-sequence, together with the target node
	    * itself, into the node-table of the corresponding IDC
	    * binding.
	    */
	    matcher = sto->matcher;
	    idc = matcher->aidc->def;
	    nbKeys = idc->nbFields;
	    pos = depth - matcher->depth;
	    /*
	    * Check if the matcher has any key-sequences at all, plus
	    * if it has a key-sequence for the current target node.
	    */
	    if ((matcher->keySeqs == NULL) ||
		(matcher->sizeKeySeqs <= pos)) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    keySeq = &(matcher->keySeqs[pos]);
	    if (*keySeq == NULL) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    for (i = 0; i < nbKeys; i++) {
		if ((*keySeq)[i] == NULL) {
		    /*
		    * Not qualified, if not all fields did resolve.
		    */
		    if (idc->type == XML_SCHEMA_TYPE_IDC_KEY) {
			/*
			* All fields of a "key" IDC must resolve.
			*/
			goto selector_key_error;
		    }
		    goto selector_leave;
		}
	    }
	    /*
	    * All fields did resolve.
	    */

	    /*
	    * 4.1 If the {identity-constraint category} is unique(/key),
	    * then no two members of the `qualified node set` have
	    * `key-sequences` whose members are pairwise equal, as
	    * defined by Equal in [XML Schemas: Datatypes].
	    *
	    * Get the IDC binding from the matcher and check for
	    * duplicate key-sequences.
	    */
#if 0
	    bind = xmlSchemaIDCAcquireBinding(vctxt, matcher);
#endif
	    targets = xmlSchemaIDCAcquireTargetList(vctxt, matcher);
	    if ((idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) &&
		(targets->nbItems != 0)) {
		xmlSchemaPSVIIDCKeyPtr ckey, bkey, *bkeySeq;
		xmlIDCHashEntryPtr e;

		res = 0;

		if (!matcher->htab)
		    e = NULL;
		else {
		    xmlChar *value = NULL;
		    xmlSchemaHashKeySequence(vctxt, &value, *keySeq, nbKeys);
		    e = xmlHashLookup(matcher->htab, value);
		    FREE_AND_NULL(value);
		}

		/*
		* Compare the key-sequences, key by key.
		*/
		for (;e; e = e->next) {
		    bkeySeq =
			((xmlSchemaPSVIIDCNodePtr) targets->items[e->index])->keys;
		    for (j = 0; j < nbKeys; j++) {
			ckey = (*keySeq)[j];
			bkey = bkeySeq[j];
			res = xmlSchemaAreValuesEqual(ckey->val, bkey->val);
			if (res == -1) {
			    return (-1);
			} else if (res == 0) {
			    /*
			    * One of the keys differs, so the key-sequence
			    * won't be equal; get out.
			    */
			    break;
			}
		    }
		    if (res == 1) {
			/*
			* Duplicate key-sequence found.
			*/
			break;
		    }
		}
		if (e) {
		    xmlChar *str = NULL, *strB = NULL;
		    /*
		    * TODO: Try to report the key-sequence.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST idc,
			"Duplicate key-sequence %s in %s",
			xmlSchemaFormatIDCKeySequence(vctxt, &str,
			    (*keySeq), nbKeys),
			xmlSchemaGetIDCDesignation(&strB, idc));
		    FREE_AND_NULL(str);
		    FREE_AND_NULL(strB);
		    goto selector_leave;
		}
	    }
	    /*
	    * Add a node-table item to the IDC binding.
	    */
	    ntItem = (xmlSchemaPSVIIDCNodePtr) xmlMalloc(
		sizeof(xmlSchemaPSVIIDCNode));
	    if (ntItem == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "allocating an IDC node-table item", NULL);
		xmlFree(*keySeq);
		*keySeq = NULL;
		return(-1);
	    }
	    memset(ntItem, 0, sizeof(xmlSchemaPSVIIDCNode));

	    /*
	    * Store the node-table item in a global list.
	    */
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		if (xmlSchemaIDCStoreNodeTableItem(vctxt, ntItem) == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
		ntItem->nodeQNameID = -1;
	    } else {
		/*
		* Save a cached QName for this node on the IDC node, to be
		* able to report it, even if the node is not saved.
		*/
		ntItem->nodeQNameID = xmlSchemaVAddNodeQName(vctxt,
		    vctxt->inode->localName, vctxt->inode->nsName);
		if (ntItem->nodeQNameID == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
	    }
	    /*
	    * Init the node-table item: Save the node, position and
	    * consume the key-sequence.
	    */
	    ntItem->node = vctxt->node;
	    ntItem->nodeLine = vctxt->inode->nodeLine;
	    ntItem->keys = *keySeq;
	    *keySeq = NULL;
#if 0
	    if (xmlSchemaIDCAppendNodeTableItem(bind, ntItem) == -1)
#endif
	    if (xmlSchemaItemListAdd(targets, ntItem) == -1) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
		    /*
		    * Free the item, since keyref items won't be
		    * put on a global list.
		    */
		    xmlFree(ntItem->keys);
		    xmlFree(ntItem);
		}
		return (-1);
	    }
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		xmlChar *value = NULL;
		xmlIDCHashEntryPtr r, e;
		if (!matcher->htab)
		  matcher->htab = xmlHashCreate(4);
		xmlSchemaHashKeySequence(vctxt, &value, ntItem->keys, nbKeys);
		e = xmlMalloc(sizeof *e);
		e->index = targets->nbItems - 1;
		r = xmlHashLookup(matcher->htab, value);
		if (r) {
		    e->next = r->next;
		    r->next = e;
		} else {
		    e->next = NULL;
		    xmlHashAddEntry(matcher->htab, value, e);
		}
		FREE_AND_NULL(value);
	    }

	    goto selector_leave;
selector_key_error:
	    {
		xmlChar *str = NULL;
		/*
		* 4.2.1 (KEY) The `target node set` and the
		* `qualified node set` are equal, that is, every
		* member of the `target node set` is also a member
		* of the `qualified node set` and vice versa.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST idc,
		    "Not all fields of %s evaluate to a node",
		    xmlSchemaGetIDCDesignation(&str, idc), NULL);
		FREE_AND_NULL(str);
	    }
selector_leave:
	    /*
	    * Free the key-sequence if not added to the IDC table.
	    */
	    if ((keySeq != NULL) && (*keySeq != NULL)) {
		xmlFree(*keySeq);
		*keySeq = NULL;
	    }
	} /* if selector */

	sto->nbHistory--;

deregister_check:
	/*
	* Deregister state objects if they reach the depth of creation.
	*/
	if ((sto->nbHistory == 0) && (sto->depth == depth)) {
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext, "IDC:   STO pop '%s'\n",
		sto->sel->xpath);
#endif
	    if (vctxt->xpathStates != sto) {
		VERROR_INT("xmlSchemaXPathProcessHistory",
		    "The state object to be removed is not the first "
		    "in the list");
	    }
	    nextsto = sto->next;
	    /*
	    * Unlink from the list of active XPath state objects.
	    */
	    vctxt->xpathStates = sto->next;
	    sto->next = vctxt->xpathStatePool;
	    /*
	    * Link it to the pool of reusable state objects.
	    */
	    vctxt->xpathStatePool = sto;
	    sto = nextsto;
	} else
	    sto = sto->next;
    } /* while (sto != NULL) */
    return (0);
}